

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O2

void __thiscall egc::Sequencer::BZMF(Sequencer *this,unsigned_short instruction)

{
  unsigned_short word;
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"BZMF");
  poVar1 = std::operator<<(poVar1," ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 0x40;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,instruction & 0xfff);
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::endl<char,std::char_traits<char>>(poVar1);
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0,0);
  if (word == 0 || (word >> 0xe & 1) != 0) {
    Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,5,instruction & 0xfff);
  }
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                0,word);
  return;
}

Assistant:

void egc::Sequencer::BZMF (unsigned short instruction)
{
    unsigned short k = instruction & 007777u;

    std::cout << "BZMF" << " " << std::oct << k << std::dec << std::endl;

    auto a = m_Memory->Read(000000u);

    if (a == 000000u || a & 040000u)
    {
        m_Memory->Write(00005u, k);
    }

    m_Memory->Write(00000u, a);
}